

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O2

void conditional_EBNF(Grammar *g)

{
  anon_struct_40_4_d8687ec6_for_rules *v;
  anon_struct_40_4_d8687ec6_for_elems *v_00;
  uint uVar1;
  Elem **ppEVar2;
  Rule **ppRVar3;
  Production *p;
  Rule *pRVar4;
  ulong uVar5;
  Elem *pEVar6;
  Rule **ppRVar7;
  
  p = new_internal_production(g,g->p);
  p->field_0x3c = p->field_0x3c & 0xe3 | 8;
  pRVar4 = new_rule(g,p);
  ppEVar2 = (pRVar4->elems).v;
  if (ppEVar2 == (Elem **)0x0) {
    pEVar6 = (g->r->elems).v[(g->r->elems).n - 1];
    (pRVar4->elems).v = (pRVar4->elems).e;
    uVar1 = (pRVar4->elems).n;
    uVar5 = (ulong)uVar1;
    (pRVar4->elems).n = uVar1 + 1;
    (pRVar4->elems).e[uVar5] = pEVar6;
  }
  else {
    v_00 = &pRVar4->elems;
    uVar1 = (pRVar4->elems).n;
    uVar5 = (ulong)uVar1;
    if (ppEVar2 == (pRVar4->elems).e) {
      if (2 < uVar1) goto LAB_001386c5;
    }
    else if ((uVar1 & 7) == 0) {
LAB_001386c5:
      vec_add_internal(v_00,(g->r->elems).v[(g->r->elems).n - 1]);
      uVar5 = (ulong)(v_00->n - 1);
      goto LAB_001386e7;
    }
    pEVar6 = (g->r->elems).v[(g->r->elems).n - 1];
    v_00->n = uVar1 + 1;
    ppEVar2[uVar5] = pEVar6;
  }
LAB_001386e7:
  (g->r->elems).v[(g->r->elems).n - 1]->rule = pRVar4;
  (pRVar4->elems).v[uVar5]->rule = pRVar4;
  v = &p->rules;
  ppRVar3 = (p->rules).v;
  ppRVar7 = (p->rules).e;
  if (ppRVar3 == (Rule **)0x0) {
    (p->rules).v = ppRVar7;
    uVar1 = (p->rules).n;
    (p->rules).n = uVar1 + 1;
    (p->rules).e[uVar1] = pRVar4;
  }
  else {
    uVar1 = v->n;
    if (ppRVar3 == ppRVar7) {
      if (2 < uVar1) goto LAB_0013875b;
    }
    else if ((uVar1 & 7) == 0) {
LAB_0013875b:
      vec_add_internal(v,pRVar4);
      goto LAB_00138766;
    }
    v->n = uVar1 + 1;
    ppRVar3[uVar1] = pRVar4;
  }
LAB_00138766:
  ppRVar3 = (p->rules).v;
  if (ppRVar3 == (Rule **)0x0) {
    pRVar4 = new_rule(g,p);
    (p->rules).v = ppRVar7;
    uVar1 = (p->rules).n;
    (p->rules).n = uVar1 + 1;
    (p->rules).e[uVar1] = pRVar4;
    goto LAB_001387d8;
  }
  uVar1 = (p->rules).n;
  if (ppRVar3 == ppRVar7) {
    if (2 < uVar1) goto LAB_001387c2;
  }
  else if ((uVar1 & 7) == 0) {
LAB_001387c2:
    pRVar4 = new_rule(g,p);
    vec_add_internal(v,pRVar4);
    goto LAB_001387d8;
  }
  pRVar4 = new_rule(g,p);
  uVar1 = (p->rules).n;
  (p->rules).n = uVar1 + 1;
  (p->rules).v[uVar1] = pRVar4;
LAB_001387d8:
  pEVar6 = new_elem_nterm(p,g->r);
  (g->r->elems).v[(g->r->elems).n - 1] = pEVar6;
  return;
}

Assistant:

void conditional_EBNF(Grammar *g) {
  Production *pp;
  Rule *rr;

  pp = new_internal_production(g, g->p);
  pp->internal = INTERNAL_CONDITIONAL;
  rr = new_rule(g, pp);
  vec_add(&rr->elems, last_elem(g->r));
  last_elem(g->r)->rule = rr;
  rr->elems.v[rr->elems.n - 1]->rule = rr;
  vec_add(&pp->rules, rr);
  vec_add(&pp->rules, new_rule(g, pp));
  last_elem(g->r) = new_elem_nterm(pp, g->r);
}